

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O2

double __thiscall chrono::fea::ChElementShellBST::GetDensity(ChElementShellBST *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  pointer pLVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pLVar3 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar6 = ZEXT816(0) << 0x40;
  lVar4 = 0x18;
  uVar5 = 0;
  while (uVar5 < (ulong)(((long)(this->m_layers).
                                super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar3) / 0x28))
  {
    std::__shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_40,
                 (__shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)pLVar3 + lVar4 + -0x10));
    dVar1 = (local_40._M_ptr)->density;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    pLVar3 = (this->m_layers).
             super__Vector_base<chrono::fea::ChElementShellBST::Layer,_std::allocator<chrono::fea::ChElementShellBST::Layer>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auVar6._8_8_ = 0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar1;
    uVar5 = uVar5 + 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = *(ulong *)((long)&pLVar3->m_element + lVar4);
    auVar6 = vfmadd231sd_fma(auVar6,auVar7,auVar2);
    lVar4 = lVar4 + 0x28;
  }
  return auVar6._0_8_ / this->tot_thickness;
}

Assistant:

double ChElementShellBST::GetDensity() {
    double tot_density = 0;
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
		double rho = m_layers[kl].GetMaterial()->GetDensity();
        double layerthick = m_layers[kl].Get_thickness();
        tot_density += rho * layerthick;
    }
    return tot_density / tot_thickness;
}